

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.h
# Opt level: O2

void __thiscall Var::~Var(Var *this)

{
  ~Var(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~Var(){

    }